

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc-twoparty-test.c++
# Opt level: O2

void __thiscall capnp::_::anon_unknown_0::TestCase383::run(TestCase383 *this)

{
  int iVar1;
  int __flags;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char *__n;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *__buf;
  int callCount;
  Promise<void> listenPromise;
  Own<kj::NetworkAddress,_std::nullptr_t> address;
  Own<kj::ConnectionReceiver,_std::nullptr_t> listener;
  Response<capnproto_test::capnp::test::TestInterface::FooResults> response;
  DebugComparison<const_char_(&)[4],_capnp::Text::Reader> _kjCondition_1;
  ArrayPtr<const_char> local_558;
  char *local_548;
  Own<kj::AsyncIoStream,_std::nullptr_t> connection;
  Own<capnp::ClientHook,_std::nullptr_t> local_530;
  char *local_520;
  undefined *puStack_518;
  void *local_510;
  char *local_508;
  undefined *puStack_500;
  void *local_4f8;
  char *local_4f0;
  undefined *puStack_4e8;
  void *local_4e0;
  char *local_4d8;
  undefined *puStack_4d0;
  void *local_4c8;
  AsyncIoContext ioContext;
  Client cap;
  undefined1 local_478 [24];
  Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
  request;
  Maybe<capnp::MessageSize> local_428;
  TwoPartyServer server;
  TwoPartyClient client;
  
  kj::setupAsyncIo();
  callCount = 0;
  kj::heap<capnp::_::TestInterfaceImpl,int&>((kj *)&client,&callCount);
  Capability::Client::Client<capnp::_::TestInterfaceImpl,void>
            ((Client *)&local_530,(Own<capnp::_::TestInterfaceImpl,_std::nullptr_t> *)&client);
  local_478[0] = false;
  TwoPartyServer::TwoPartyServer
            (&server,(Client *)&local_530,
             (Maybe<kj::Function<kj::String_(const_kj::Exception_&)>_> *)local_478);
  kj::_::NullableValue<kj::Function<kj::String_(const_kj::Exception_&)>_>::~NullableValue
            ((NullableValue<kj::Function<kj::String_(const_kj::Exception_&)>_> *)local_478);
  kj::Own<capnp::ClientHook,_std::nullptr_t>::dispose(&local_530);
  kj::Own<capnp::_::TestInterfaceImpl,_std::nullptr_t>::dispose
            ((Own<capnp::_::TestInterfaceImpl,_std::nullptr_t> *)&client);
  iVar1 = (*(ioContext.provider.ptr)->_vptr_AsyncIoProvider[3])();
  (*(code *)**(undefined8 **)CONCAT44(extraout_var,iVar1))
            (&client,(undefined8 *)CONCAT44(extraout_var,iVar1),"127.0.0.1",10,0);
  local_4d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-twoparty-test.c++"
  ;
  puStack_4d0 = &DAT_0042222c;
  local_4c8 = (void *)0x1200000185;
  kj::Promise<kj::Own<kj::NetworkAddress,_std::nullptr_t>_>::wait
            ((Promise<kj::Own<kj::NetworkAddress,_std::nullptr_t>_> *)&address,&client);
  kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&client);
  (*(address.ptr)->_vptr_NetworkAddress[2])(&listener);
  TwoPartyServer::listen((TwoPartyServer *)&listenPromise,(int)&server,(int)listener.ptr);
  iVar1 = (*(ioContext.provider.ptr)->_vptr_AsyncIoProvider[3])();
  __flags = (*(listener.ptr)->_vptr_ConnectionReceiver[2])();
  __n = (char *)0xa;
  (*(code *)**(undefined8 **)CONCAT44(extraout_var_00,iVar1))
            (&response,(undefined8 *)CONCAT44(extraout_var_00,iVar1),"127.0.0.1");
  local_4f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-twoparty-test.c++"
  ;
  puStack_4e8 = &DAT_0042222c;
  local_4e0 = (void *)0xd0000018b;
  kj::Promise<kj::Own<kj::NetworkAddress,_std::nullptr_t>_>::wait
            ((Promise<kj::Own<kj::NetworkAddress,_std::nullptr_t>_> *)&client,&response);
  kj::Own<kj::NetworkAddress,_std::nullptr_t>::operator=
            (&address,(Own<kj::NetworkAddress,_std::nullptr_t> *)&client);
  kj::Own<kj::NetworkAddress,_std::nullptr_t>::dispose
            ((Own<kj::NetworkAddress,_std::nullptr_t> *)&client);
  kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&response);
  (**(address.ptr)->_vptr_NetworkAddress)(&client);
  local_508 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-twoparty-test.c++"
  ;
  puStack_500 = &DAT_0042222c;
  local_4f8 = (void *)0x150000018e;
  kj::Promise<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_>::wait
            ((Promise<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_> *)&connection,&client);
  kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&client);
  TwoPartyClient::TwoPartyClient(&client,connection.ptr);
  TwoPartyClient::bootstrap((TwoPartyClient *)&response);
  Capability::Client::castAs<capnproto_test::capnp::test::TestInterface>(&cap,(Client *)&response);
  kj::Own<capnp::ClientHook,_std::nullptr_t>::dispose
            ((Own<capnp::ClientHook,_std::nullptr_t> *)&response);
  local_428.ptr.isSet = false;
  capnproto_test::capnp::test::TestInterface::Client::fooRequest(&request,&cap,&local_428);
  *(undefined4 *)request.super_Builder._builder.data = 0x7b;
  *(byte *)((long)request.super_Builder._builder.data + 4) =
       *(byte *)((long)request.super_Builder._builder.data + 4) | 1;
  response.super_Reader._reader.segment._0_4_ = 0;
  response.super_Reader._reader.dataSize._0_1_ = callCount == 0;
  response.super_Reader._reader.data = anon_var_dwarf_3d166;
  response.super_Reader._reader.pointers = (WirePointer *)&DAT_00000005;
  __buf = extraout_RDX;
  response.super_Reader._reader.capTable = (CapTableReader *)&callCount;
  if ((!(bool)(undefined1)response.super_Reader._reader.dataSize) && (kj::_::Debug::minSeverity < 3)
     ) {
    _kjCondition_1.left._0_4_ = 0;
    __n = "\"failed: expected \" \"(0) == (callCount)\", _kjCondition, 0, callCount";
    __flags = 0x422275;
    kj::_::Debug::log<char_const(&)[36],kj::_::DebugComparison<int,int&>&,int,int&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-twoparty-test.c++"
               ,0x195,ERROR,
               "\"failed: expected \" \"(0) == (callCount)\", _kjCondition, 0, callCount",
               (char (*) [36])"failed: expected (0) == (callCount)",
               (DebugComparison<int,_int_&> *)&response,(int *)&_kjCondition_1,&callCount);
    __buf = extraout_RDX_00;
  }
  Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
  ::send((Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
          *)&_kjCondition_1,(int)&request,__buf,(size_t)__n,__flags);
  local_520 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-twoparty-test.c++"
  ;
  puStack_518 = &DAT_0042222c;
  local_510 = (void *)0x1300000196;
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestInterface::FooResults>_>::wait
            ((Promise<capnp::Response<capnproto_test::capnp::test::TestInterface::FooResults>_> *)
             &response,&_kjCondition_1);
  RemotePromise<capnproto_test::capnp::test::TestInterface::FooResults>::~RemotePromise
            ((RemotePromise<capnproto_test::capnp::test::TestInterface::FooResults> *)
             &_kjCondition_1);
  local_548 = "foo";
  local_558 = (ArrayPtr<const_char>)
              capnproto_test::capnp::test::TestInterface::FooResults::Reader::getX
                        (&response.super_Reader);
  kj::_::DebugExpression<char_const(&)[4]>::operator==
            (&_kjCondition_1,(DebugExpression<char_const(&)[4]> *)&local_548,(Reader *)&local_558);
  if (kj::_::Debug::minSeverity < 3 && _kjCondition_1.result == false) {
    local_558 = (ArrayPtr<const_char>)
                capnproto_test::capnp::test::TestInterface::FooResults::Reader::getX
                          (&response.super_Reader);
    kj::_::Debug::
    log<char_const(&)[46],kj::_::DebugComparison<char_const(&)[4],capnp::Text::Reader>&,char_const(&)[4],capnp::Text::Reader>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-twoparty-test.c++"
               ,0x197,ERROR,
               "\"failed: expected \" \"(\\\"foo\\\") == (response.getX())\", _kjCondition, \"foo\", response.getX()"
               ,(char (*) [46])"failed: expected (\"foo\") == (response.getX())",&_kjCondition_1,
               (char (*) [4])"foo",(Reader *)&local_558);
  }
  _kjCondition_1.op.content.size_._0_1_ = callCount == 1;
  _kjCondition_1.left._0_4_ = 1;
  _kjCondition_1.right.super_StringPtr.content.size_ = (size_t)anon_var_dwarf_3d166;
  _kjCondition_1.op.content.ptr = &DAT_00000005;
  _kjCondition_1.right.super_StringPtr.content.ptr = (char *)&callCount;
  if ((!(bool)(undefined1)_kjCondition_1.op.content.size_) && (kj::_::Debug::minSeverity < 3)) {
    local_558.ptr._0_4_ = 1;
    kj::_::Debug::log<char_const(&)[36],kj::_::DebugComparison<int,int&>&,int,int&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-twoparty-test.c++"
               ,0x198,ERROR,
               "\"failed: expected \" \"(1) == (callCount)\", _kjCondition, 1, callCount",
               (char (*) [36])"failed: expected (1) == (callCount)",
               (DebugComparison<int,_int_&> *)&_kjCondition_1,(int *)&local_558,&callCount);
  }
  kj::Own<capnp::ResponseHook,_std::nullptr_t>::dispose(&response.hook);
  kj::Own<capnp::RequestHook,_std::nullptr_t>::dispose(&request.hook);
  kj::Own<capnp::ClientHook,_std::nullptr_t>::dispose
            ((Own<capnp::ClientHook,_std::nullptr_t> *)&cap.field_0x8);
  TwoPartyClient::~TwoPartyClient(&client);
  kj::Own<kj::AsyncIoStream,_std::nullptr_t>::dispose(&connection);
  kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&listenPromise);
  kj::Own<kj::ConnectionReceiver,_std::nullptr_t>::dispose(&listener);
  kj::Own<kj::NetworkAddress,_std::nullptr_t>::dispose(&address);
  TwoPartyServer::~TwoPartyServer(&server);
  kj::AsyncIoContext::~AsyncIoContext(&ioContext);
  return;
}

Assistant:

TEST(TwoPartyNetwork, ConvenienceClasses) {
  auto ioContext = kj::setupAsyncIo();

  int callCount = 0;
  TwoPartyServer server(kj::heap<TestInterfaceImpl>(callCount));

  auto address = ioContext.provider->getNetwork()
      .parseAddress("127.0.0.1").wait(ioContext.waitScope);

  auto listener = address->listen();
  auto listenPromise = server.listen(*listener);

  address = ioContext.provider->getNetwork()
      .parseAddress("127.0.0.1", listener->getPort()).wait(ioContext.waitScope);

  auto connection = address->connect().wait(ioContext.waitScope);
  TwoPartyClient client(*connection);
  auto cap = client.bootstrap().castAs<test::TestInterface>();

  auto request = cap.fooRequest();
  request.setI(123);
  request.setJ(true);
  EXPECT_EQ(0, callCount);
  auto response = request.send().wait(ioContext.waitScope);
  EXPECT_EQ("foo", response.getX());
  EXPECT_EQ(1, callCount);
}